

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DensityHistogram.cpp
# Opt level: O0

void __thiscall OpenMD::DensityHistogram::process(DensityHistogram *this)

{
  double dVar1;
  bool bVar2;
  SnapshotManager *this_00;
  Snapshot *pSVar3;
  reference pvVar4;
  size_type sVar5;
  reference pdVar6;
  DumpReader *in_RDI;
  RealType RVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool hist_update;
  RealType density_length;
  iterator index;
  int bin_center_pos;
  int j;
  RealType delta_density;
  RealType max;
  RealType min;
  int istep;
  vector<double,_std::allocator<double>_> density;
  int nFrames;
  DumpReader reader;
  int ii;
  StuntDouble *sd;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffec18;
  DumpReader *in_stack_ffffffffffffec20;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffec28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffec30;
  SelectionEvaluator *in_stack_ffffffffffffec58;
  errorStruct *peVar10;
  undefined1 *in_stack_ffffffffffffeca8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1320;
  int local_1314;
  undefined8 local_1310;
  double local_1308;
  int local_12fc;
  double local_12f8;
  double local_12f0;
  double local_12e8;
  double local_12e0;
  double *local_12d8;
  double *local_12d0;
  RealType local_12c8;
  int local_12bc;
  vector<double,_std::allocator<double>_> local_12b8;
  int local_129c;
  string *in_stack_ffffffffffffee70;
  SimInfo *in_stack_ffffffffffffee78;
  DumpReader *in_stack_ffffffffffffee80;
  undefined1 local_30 [32];
  StuntDouble *local_10;
  
  bVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)&in_RDI->field_0xf8);
  if (bVar2) {
    in_stack_ffffffffffffeca8 = local_30;
    SelectionEvaluator::evaluate(in_stack_ffffffffffffec58);
    SelectionManager::setSelectionSet
              ((SelectionManager *)in_stack_ffffffffffffec30._M_current,
               (SelectionSet *)in_stack_ffffffffffffec28._M_current);
    SelectionSet::~SelectionSet((SelectionSet *)0x1f7b7d);
  }
  DumpReader::DumpReader
            (in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70);
  local_129c = DumpReader::getNFrames(in_stack_ffffffffffffec20);
  *(int *)&in_RDI->field_0xd0 = local_129c / *(int *)&in_RDI->inFile_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1f7c18);
  *(int *)&in_RDI->field_0xd0 = local_129c / *(int *)&in_RDI->inFile_;
  for (local_12bc = 0; local_12bc < local_129c; local_12bc = *(int *)&in_RDI->inFile_ + local_12bc)
  {
    DumpReader::readFrame(in_RDI,(int)((ulong)in_stack_ffffffffffffeca8 >> 0x20));
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)&in_RDI->filename_);
    pSVar3 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)&in_RDI->field_0xc8 = pSVar3;
    local_10 = SelectionManager::beginSelected
                         ((SelectionManager *)in_stack_ffffffffffffec30._M_current,
                          (int *)in_stack_ffffffffffffec28._M_current);
    while (local_10 != (StuntDouble *)0x0) {
      RVar7 = StuntDouble::getDensity((StuntDouble *)in_stack_ffffffffffffec20);
      if ((RVar7 != 0.0) || (NAN(RVar7))) {
        local_12c8 = StuntDouble::getDensity((StuntDouble *)in_stack_ffffffffffffec20);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec20,
                   (value_type_conflict2 *)in_stack_ffffffffffffec18);
      }
      local_10 = SelectionManager::nextSelected
                           ((SelectionManager *)in_stack_ffffffffffffec30._M_current,
                            (int *)in_stack_ffffffffffffec28._M_current);
    }
  }
  bVar2 = std::vector<double,_std::allocator<double>_>::empty
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec30._M_current
                    );
  if (bVar2) {
    peVar10 = &painCave;
    snprintf(painCave.errMsg,2000,"Density for selected atom not found.\n");
    peVar10->isFatal = 1;
    simError();
  }
  local_12d0 = (double *)
               std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffec18);
  local_12d8 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffec18);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (in_stack_ffffffffffffec30,in_stack_ffffffffffffec28);
  pvVar4 = std::vector<double,_std::allocator<double>_>::front
                     ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec20);
  local_12e0 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::back
                     ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec20);
  local_12e8 = *pvVar4;
  local_12f0 = (local_12e8 - local_12e0) / (double)*(int *)(in_RDI->buffer + 0x4ba);
  in_RDI->buffer[0x4c2] = '\0';
  in_RDI->buffer[0x4c3] = '\0';
  in_RDI->buffer[0x4c4] = '\0';
  in_RDI->buffer[0x4c5] = '\0';
  in_RDI->buffer[0x4c6] = '\0';
  in_RDI->buffer[0x4c7] = '\0';
  in_RDI->buffer[0x4c8] = '\0';
  in_RDI->buffer[0x4c9] = '\0';
  if ((local_12f0 == 0.0) && (!NAN(local_12f0))) {
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec30._M_current,
               in_stack_ffffffffffffec28._M_current);
    sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_12b8);
    auVar8._8_4_ = (int)(sVar5 >> 0x20);
    auVar8._0_8_ = sVar5;
    auVar8._12_4_ = 0x45300000;
    local_12f8 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec20,
               (value_type_conflict2 *)in_stack_ffffffffffffec18);
    *(double *)(in_RDI->buffer + 0x4c2) = local_12e0;
LAB_001f830a:
    (*(code *)(in_RDI->info_->randNumGen_).
              super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)();
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec30._M_current);
    DumpReader::~DumpReader(in_stack_ffffffffffffec20);
    return;
  }
  for (local_12fc = 0; local_12fc < *(int *)(in_RDI->buffer + 0x4ba) + 3;
      local_12fc = local_12fc + 1) {
    local_1308 = (double)(local_12fc + -1) * local_12f0 + local_12e0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec20,
               (value_type_conflict2 *)in_stack_ffffffffffffec18);
    local_1310 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffec20,
               (value_type_conflict2 *)in_stack_ffffffffffffec18);
  }
  local_1314 = 0;
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(&local_1320);
  sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_12b8);
  auVar9._8_4_ = (int)(sVar5 >> 0x20);
  auVar9._0_8_ = sVar5;
  auVar9._12_4_ = 0x45300000;
  local_1320._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffec18);
LAB_001f80ce:
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffec18);
  bVar2 = __gnu_cxx::operator<
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     in_stack_ffffffffffffec20,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     in_stack_ffffffffffffec18);
  if (bVar2) {
    bVar2 = true;
LAB_001f8109:
    do {
      if (!bVar2) goto LAB_001f827f;
      pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_1320);
      dVar1 = *pdVar6;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI->buffer + 0x4ca),
                          (long)local_1314);
      if (*pvVar4 <= dVar1) {
        pdVar6 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_1320);
        dVar1 = *pdVar6;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI->buffer + 0x4ca),
                            (long)(local_1314 + 1));
        if (dVar1 < *pvVar4) {
          in_stack_ffffffffffffec30._M_current =
               (double *)
               (1.0 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)));
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI->buffer + 0x4e2),
                              (long)local_1314);
          *pvVar4 = (double)in_stack_ffffffffffffec30._M_current + *pvVar4;
          bVar2 = false;
          goto LAB_001f8109;
        }
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI->buffer + 0x4e2),
                          (long)local_1314);
      in_stack_ffffffffffffec28._M_current = (double *)*pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI->buffer + 0x4ca),
                          (long)local_1314);
      *(double *)(in_RDI->buffer + 0x4c2) =
           (double)in_stack_ffffffffffffec28._M_current * *pvVar4 +
           *(double *)(in_RDI->buffer + 0x4c2);
      local_1314 = local_1314 + 1;
      bVar2 = true;
    } while( true );
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI->buffer + 0x4e2),
                      (long)local_1314);
  in_stack_ffffffffffffec20 = (DumpReader *)*pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI->buffer + 0x4ca),
                      (long)local_1314);
  *(double *)(in_RDI->buffer + 0x4c2) =
       (double)in_stack_ffffffffffffec20 * *pvVar4 + *(double *)(in_RDI->buffer + 0x4c2);
  goto LAB_001f830a;
LAB_001f827f:
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator++
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             in_stack_ffffffffffffec28._M_current,(int)((ulong)in_stack_ffffffffffffec20 >> 0x20));
  goto LAB_001f80ce;
}

Assistant:

void DensityHistogram::process() {
    StuntDouble* sd;
    int ii;

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;
    vector<RealType> density;

    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        if (sd->getDensity()) density.push_back(sd->getDensity());
      }
    }

    if (density.empty()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Density for selected atom not found.\n");
      painCave.isFatal = 1;
      simError();
    }

    std::sort(density.begin(), density.end());

    RealType min = density.front();
    RealType max = density.back();

    RealType delta_density = (max - min) / (nBins_);
    averageDensity_        = 0;
    if (delta_density == 0) {
      bincenter_.push_back(min);
      histList_.push_back(density.size());
      averageDensity_ = min;
    } else {
      // fill the center for histogram
      for (int j = 0; j < nBins_ + 3; ++j) {
        bincenter_.push_back(min + (j - 1) * delta_density);
        histList_.push_back(0);
      }
      // filling up the histogram whith the densities
      int bin_center_pos = 0;
      vector<RealType>::iterator index;
      RealType density_length = static_cast<RealType>(density.size());

      bool hist_update;
      for (index = density.begin(); index < density.end(); index++) {
        hist_update = true;
        while (hist_update) {
          if (*index >= bincenter_[bin_center_pos] &&
              *index < bincenter_[bin_center_pos + 1]) {
            histList_[bin_center_pos] += 1.0 / density_length;
            hist_update = false;
          } else {
            averageDensity_ +=
                histList_[bin_center_pos] * bincenter_[bin_center_pos];
            bin_center_pos++;
            hist_update = true;
          }
        }
      }
      averageDensity_ += histList_[bin_center_pos] * bincenter_[bin_center_pos];
    }
    writeDensity();
  }